

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

uint sf::Texture::getValidSize(uint size)

{
  uint powerOfTwo;
  uint size_local;
  undefined4 local_4;
  
  local_4 = size;
  if (SF_GLAD_GL_ARB_texture_non_power_of_two == 0) {
    for (powerOfTwo = 1; powerOfTwo < size; powerOfTwo = powerOfTwo << 1) {
    }
    local_4 = powerOfTwo;
  }
  return local_4;
}

Assistant:

unsigned int Texture::getValidSize(unsigned int size)
{
    if (GLEXT_texture_non_power_of_two)
    {
        // If hardware supports NPOT textures, then just return the unmodified size
        return size;
    }
    else
    {
        // If hardware doesn't support NPOT textures, we calculate the nearest power of two
        unsigned int powerOfTwo = 1;
        while (powerOfTwo < size)
            powerOfTwo *= 2;

        return powerOfTwo;
    }
}